

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

int __thiscall QMainWindowLayoutState::remove(QMainWindowLayoutState *this,char *__filename)

{
  int iVar1;
  int *piVar2;
  long in_FS_OFFSET;
  int i;
  QList<int> *in_stack_ffffffffffffffa0;
  QToolBarAreaLayout *this_00;
  QMainWindowLayoutState *len;
  qsizetype in_stack_ffffffffffffffc8;
  QList<int> *in_stack_ffffffffffffffd0;
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  len = this;
  piVar2 = QList<int>::first(in_stack_ffffffffffffffa0);
  iVar1 = *piVar2;
  if (iVar1 == 0) {
    this_00 = &this->toolBarAreaLayout;
    QList<int>::mid(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(qsizetype)len);
    QToolBarAreaLayout::remove(this_00,local_20);
    QList<int>::~QList((QList<int> *)0x5f4203);
  }
  if (iVar1 == 1) {
    QList<int>::mid(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(qsizetype)len);
    QDockAreaLayout::remove(&this->dockAreaLayout,&stack0xffffffffffffffc8);
    QList<int>::~QList((QList<int> *)0x5f424c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutState::remove(const QList<int> &path)
{
    int i = path.first();

#if QT_CONFIG(toolbar)
    if (i == 0)
        toolBarAreaLayout.remove(path.mid(1));
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        dockAreaLayout.remove(path.mid(1));
#endif // QT_CONFIG(dockwidget)
}